

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  semantic_tag param_1,ser_context *param_2,error_code *ec)

{
  int iVar1;
  cbor_container_type local_c;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  if (iVar1 < *(int *)((this->options_)._vptr_cbor_encode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_cbor_encode_options)) {
    local_c = indefinite_length_object;
    std::
    vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
    ::emplace_back<jsoncons::cbor::cbor_container_type>(&this->stack_,&local_c);
    binary_stream_sink::push_back(&this->sink_,0xbf);
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = cbor_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(cbor_container_type::indefinite_length_object);
        
        sink_.push_back(0xbf);
        JSONCONS_VISITOR_RETURN;
    }